

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2predicates.cc
# Opt level: O0

int __thiscall
s2pred::TriageCompareCosDistances<long_double>
          (s2pred *this,Vector3<long_double> *x,Vector3<long_double> *a,Vector3<long_double> *b)

{
  longdouble in_ST0;
  longdouble in_ST1;
  uint local_8c;
  longdouble error;
  longdouble diff;
  longdouble cos_bx;
  longdouble cos_ax;
  longdouble cos_bx_error;
  longdouble cos_ax_error;
  Vector3<long_double> *local_20;
  Vector3<long_double> *b_local;
  Vector3<long_double> *a_local;
  Vector3<long_double> *x_local;
  
  local_20 = a;
  b_local = x;
  a_local = (Vector3<long_double> *)this;
  GetCosDistance((longdouble *)x,(Vector3_ld *)this,(Vector3_ld *)((long)&cos_bx_error + 8),
                 (longdouble *)b);
  GetCosDistance((longdouble *)local_20,a_local,(Vector3_ld *)((long)&cos_ax + 8),(longdouble *)b);
  if (in_ST0 - in_ST1 <= stack0xffffffffffffffb8 + stack0xffffffffffffffc8) {
    local_8c = (uint)(in_ST0 - in_ST1 < -(stack0xffffffffffffffb8 + stack0xffffffffffffffc8));
  }
  else {
    local_8c = 0xffffffff;
  }
  return local_8c;
}

Assistant:

int TriageCompareCosDistances(const Vector3<T>& x,
                              const Vector3<T>& a, const Vector3<T>& b) {
  T cos_ax_error, cos_bx_error;
  T cos_ax = GetCosDistance(a, x, &cos_ax_error);
  T cos_bx = GetCosDistance(b, x, &cos_bx_error);
  T diff = cos_ax - cos_bx;
  T error = cos_ax_error + cos_bx_error;
  return (diff > error) ? -1 : (diff < -error) ? 1 : 0;
}